

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Geometry.cpp
# Opt level: O1

SP __thiscall pbrt::SemanticParser::emitTriangleMesh(SemanticParser *this,SP *shape)

{
  element_type *peVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined8 uVar6;
  _func_int **pp_Var7;
  long lVar8;
  element_type *peVar9;
  element_type *peVar10;
  float fVar11;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var12;
  vec3f *v;
  element_type *peVar13;
  element_type *peVar14;
  long *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var15;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  shared_ptr<pbrt::syntactic::ParamArray<float>_> sVar27;
  SP SVar28;
  SP ours;
  shared_ptr<pbrt::syntactic::ParamArray<float>_> alphaParam;
  undefined1 local_e8 [32];
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_c8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_c0 [2];
  undefined1 local_b0 [16];
  _Base_ptr local_a0;
  SP local_98;
  SP local_88;
  SP local_78;
  SP local_68;
  SP local_58;
  SP local_48;
  undefined8 local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  
  local_38 = *(undefined8 *)(*in_RDX + 0x58);
  local_30 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(*in_RDX + 0x60);
  if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_30->_M_use_count = local_30->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_30->_M_use_count = local_30->_M_use_count + 1;
    }
  }
  findOrCreateMaterial((SemanticParser *)local_e8,(SP *)shape);
  local_c8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<pbrt::TriangleMesh,std::allocator<pbrt::TriangleMesh>,std::shared_ptr<pbrt::Material>>
            (a_Stack_c0,(TriangleMesh **)&local_c8,(allocator<pbrt::TriangleMesh> *)local_b0,
             (shared_ptr<pbrt::Material> *)local_e8);
  std::__shared_ptr<pbrt::TriangleMesh,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<pbrt::TriangleMesh,pbrt::TriangleMesh>
            ((__shared_ptr<pbrt::TriangleMesh,(__gnu_cxx::_Lock_policy)2> *)&local_c8,
             (TriangleMesh *)local_c8._M_pi);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_);
  }
  if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
  }
  local_48.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)*in_RDX;
  local_48.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RDX[1];
  if (local_48.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_48.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_48.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_48.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_48.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  peVar1 = (element_type *)(local_e8 + 0x10);
  local_e8._0_8_ = peVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"P","");
  extractVector<pbrt::math::vec3f>
            ((vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_> *)local_b0,
             (SemanticParser *)shape,&local_48,(string *)local_e8);
  std::vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>::_M_move_assign
            ((vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_> *)(local_c8._M_pi + 7),
             local_b0);
  if ((_Base_ptr)local_b0._0_8_ != (_Base_ptr)0x0) {
    operator_delete((void *)local_b0._0_8_,(long)local_a0 - local_b0._0_8_);
  }
  if ((element_type *)local_e8._0_8_ != peVar1) {
    operator_delete((void *)local_e8._0_8_,(ulong)(local_e8._16_8_ + 1));
  }
  if (local_48.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_58.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)*in_RDX;
  local_58.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RDX[1];
  if ((_Base_ptr)
      local_58.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Base_ptr)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&((_Base_ptr)
               local_58.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_parent =
           *(int *)&((_Base_ptr)
                    local_58.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_parent + 1;
      UNLOCK();
    }
    else {
      *(int *)&((_Base_ptr)
               local_58.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_parent =
           *(int *)&((_Base_ptr)
                    local_58.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_parent + 1;
    }
  }
  local_e8._0_8_ = peVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"N","");
  extractVector<pbrt::math::vec3f>
            ((vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_> *)local_b0,
             (SemanticParser *)shape,&local_58,(string *)local_e8);
  std::vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>::_M_move_assign
            ((vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_> *)
             &(((element_type *)(local_c8._M_pi + 8))->super_Entity).
              super_enable_shared_from_this<pbrt::Entity>,local_b0);
  if ((_Base_ptr)local_b0._0_8_ != (_Base_ptr)0x0) {
    operator_delete((void *)local_b0._0_8_,(long)local_a0 - local_b0._0_8_);
  }
  if ((element_type *)local_e8._0_8_ != peVar1) {
    operator_delete((void *)local_e8._0_8_,(ulong)(local_e8._16_8_ + 1));
  }
  if ((_Base_ptr)
      local_58.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Base_ptr)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_68.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)*in_RDX;
  local_68.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RDX[1];
  if (local_68.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_68.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_68.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_68.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_68.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_e8._0_8_ = peVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"uv","");
  extractVector<pbrt::math::vec2f>
            ((vector<pbrt::math::vec2f,_std::allocator<pbrt::math::vec2f>_> *)local_b0,
             (SemanticParser *)shape,&local_68,(string *)local_e8);
  std::vector<pbrt::math::vec2f,_std::allocator<pbrt::math::vec2f>_>::_M_move_assign
            ((vector<pbrt::math::vec2f,_std::allocator<pbrt::math::vec2f>_> *)(local_c8._M_pi + 10),
             local_b0);
  if ((_Base_ptr)local_b0._0_8_ != (_Base_ptr)0x0) {
    operator_delete((void *)local_b0._0_8_,(long)local_a0 - local_b0._0_8_);
  }
  if ((element_type *)local_e8._0_8_ != peVar1) {
    operator_delete((void *)local_e8._0_8_,(ulong)(local_e8._16_8_ + 1));
  }
  if (local_68.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_78.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)*in_RDX;
  local_78.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RDX[1];
  if (local_78.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_78.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_78.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_78.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_78.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_e8._0_8_ = peVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"indices","");
  extractVector<pbrt::math::vec3i>
            ((vector<pbrt::math::vec3i,_std::allocator<pbrt::math::vec3i>_> *)local_b0,
             (SemanticParser *)shape,&local_78,(string *)local_e8);
  std::vector<pbrt::math::vec3i,_std::allocator<pbrt::math::vec3i>_>::_M_move_assign
            ((vector<pbrt::math::vec3i,_std::allocator<pbrt::math::vec3i>_> *)
             &local_c8._M_pi[0xb]._M_use_count,local_b0);
  if ((_Base_ptr)local_b0._0_8_ != (_Base_ptr)0x0) {
    operator_delete((void *)local_b0._0_8_,(long)local_a0 - local_b0._0_8_);
  }
  if ((element_type *)local_e8._0_8_ != peVar1) {
    operator_delete((void *)local_e8._0_8_,(ulong)(local_e8._16_8_ + 1));
  }
  if (local_78.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  lVar8 = *in_RDX;
  fVar2 = *(float *)(lVar8 + 0x78);
  fVar3 = *(float *)(lVar8 + 0x84);
  fVar4 = *(float *)(lVar8 + 0x98);
  peVar13 = (element_type *)
            (((_Vector_base<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_> *)
             &local_c8._M_pi[7]._vptr__Sp_counted_base)->_M_impl).super__Vector_impl_data._M_start;
  peVar9 = (element_type *)
           ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_c8._M_pi[7]._M_use_count)->_M_pi;
  fVar22 = (float)*(undefined8 *)(lVar8 + 0x7c);
  fVar23 = (float)((ulong)*(undefined8 *)(lVar8 + 0x7c) >> 0x20);
  fVar25 = (float)((ulong)*(undefined8 *)(lVar8 + 0x88) >> 0x20);
  fVar17 = (float)*(undefined8 *)(lVar8 + 0x90);
  fVar18 = (float)((ulong)*(undefined8 *)(lVar8 + 0x90) >> 0x20);
  fVar24 = (float)*(undefined8 *)(lVar8 + 0x88);
  if (peVar13 != peVar9) {
    uVar6 = *(undefined8 *)(lVar8 + 0x9c);
    fVar16 = *(float *)(lVar8 + 0xa4);
    do {
      fVar19 = *(float *)&(peVar13->super_Entity).super_enable_shared_from_this<pbrt::Entity>.
                          _M_weak_this.super___weak_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr;
      pp_Var7 = (peVar13->super_Entity)._vptr_Entity;
      fVar21 = SUB84(pp_Var7,0);
      fVar26 = (float)((ulong)pp_Var7 >> 0x20);
      (peVar13->super_Entity)._vptr_Entity =
           (_func_int **)
           CONCAT44(fVar19 * fVar18 + fVar24 * fVar26 + fVar22 * fVar21 +
                    (float)((ulong)uVar6 >> 0x20),
                    fVar19 * fVar17 + fVar2 * fVar21 + fVar3 * fVar26 + (float)uVar6);
      *(float *)&(peVar13->super_Entity).super_enable_shared_from_this<pbrt::Entity>._M_weak_this.
                 super___weak_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           fVar26 * fVar25 + fVar21 * fVar23 + fVar4 * fVar19 + fVar16;
      peVar13 = (element_type *)
                ((long)&(peVar13->super_Entity).super_enable_shared_from_this<pbrt::Entity>.
                        _M_weak_this.super___weak_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2> + 4)
      ;
    } while (peVar13 != peVar9);
  }
  peVar14 = (((element_type *)(local_c8._M_pi + 8))->super_Entity).
            super_enable_shared_from_this<pbrt::Entity>._M_weak_this.
            super___weak_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  peVar10 = (element_type *)local_c8._M_pi[9]._vptr__Sp_counted_base;
  if (peVar14 != peVar10) {
    fVar26 = fVar17 * fVar25 - fVar4 * fVar3;
    fVar16 = fVar4 * fVar24 - fVar18 * fVar25;
    fVar19 = fVar18 * fVar3 - fVar17 * fVar24;
    fVar21 = 1.0 / (fVar19 * fVar23 + fVar2 * fVar16 + fVar26 * fVar22);
    do {
      fVar11 = SUB84(peVar14->_vptr_Entity,0);
      fVar20 = (float)((ulong)peVar14->_vptr_Entity >> 0x20);
      fVar5 = *(float *)&(peVar14->super_enable_shared_from_this<pbrt::Entity>)._M_weak_this;
      peVar14->_vptr_Entity =
           (_func_int **)
           CONCAT44(fVar5 * (fVar3 * fVar23 - fVar2 * fVar25) * fVar21 +
                    (fVar2 * fVar4 - fVar23 * fVar17) * fVar21 * fVar20 + fVar26 * fVar21 * fVar11,
                    fVar5 * (fVar25 * fVar22 - fVar23 * fVar24) * fVar21 +
                    fVar16 * fVar21 * fVar11 + (fVar23 * fVar18 - fVar22 * fVar4) * fVar21 * fVar20)
      ;
      *(float *)&(peVar14->super_enable_shared_from_this<pbrt::Entity>)._M_weak_this =
           fVar11 * fVar21 * fVar19 + fVar20 * (fVar17 * fVar22 - fVar18 * fVar2) * fVar21 +
           fVar5 * fVar21 * (fVar24 * fVar2 - fVar3 * fVar22);
      peVar14 = (element_type *)((long)&peVar14->super_enable_shared_from_this<pbrt::Entity> + 4);
    } while (peVar14 != peVar10);
  }
  local_88.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_c8._M_pi;
  local_88.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       a_Stack_c0[0]._M_pi;
  if ((_Base_ptr)a_Stack_c0[0]._M_pi != (_Base_ptr)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (a_Stack_c0[0]._M_pi)->_M_use_count = (a_Stack_c0[0]._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (a_Stack_c0[0]._M_pi)->_M_use_count = (a_Stack_c0[0]._M_pi)->_M_use_count + 1;
    }
  }
  local_98.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)*in_RDX;
  local_98.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RDX[1];
  if (local_98.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_98.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_98.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_98.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_98.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  extractTextures((SemanticParser *)shape,&local_88,&local_98);
  if (local_98.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Base_ptr)
      local_88.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Base_ptr)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_88.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  lVar8 = *in_RDX;
  local_e8._0_8_ = peVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"alpha","");
  sVar27 = syntactic::ParamSet::findParam<float>((ParamSet *)local_b0,(string *)(lVar8 + 8));
  _Var15 = sVar27.super___shared_ptr<pbrt::syntactic::ParamArray<float>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  if ((element_type *)local_e8._0_8_ != peVar1) {
    operator_delete((void *)local_e8._0_8_,(ulong)(local_e8._16_8_ + 1));
    _Var15._M_pi = extraout_RDX;
  }
  _Var12._M_pi = a_Stack_c0[0]._M_pi;
  if ((_Base_ptr)local_b0._0_8_ != (_Base_ptr)0x0) {
    local_c8._M_pi[2]._M_weak_count = (*(_Base_ptr *)(local_b0._0_8_ + 0x18))->_M_color;
  }
  (this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  a_Stack_c0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_c8._M_pi;
  (this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var12._M_pi;
  local_c8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if ((_Base_ptr)local_b0._8_8_ != (_Base_ptr)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._8_8_);
    _Var15._M_pi = extraout_RDX_00;
  }
  if (a_Stack_c0[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_c0[0]._M_pi);
    _Var15._M_pi = extraout_RDX_01;
  }
  SVar28.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var15._M_pi;
  SVar28.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (SP)SVar28.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Shape::SP SemanticParser::emitTriangleMesh(pbrt::syntactic::Shape::SP shape)
  {
    TriangleMesh::SP ours = std::make_shared<TriangleMesh>(findOrCreateMaterial(shape->material));

    // vertices - param "P", 3x float each
    ours->vertex = extractVector<vec3f>(shape,"P");
    // vertex normals - param "N", 3x float each
    ours->normal = extractVector<vec3f>(shape,"N");
    // per-vertex texture coordinates - param "uv", 2x float each
    ours->texcoord = extractVector<vec2f>(shape,"uv");
    // triangle vertex indices - param "indices", 3x int each
    ours->index = extractVector<vec3i>(shape,"indices");

    affine3f xfm = shape->transform.atStart;
    for (vec3f &v : ours->vertex)
      v = xfmPoint(xfm,v);
    for (vec3f &v : ours->normal)
      v = xfmNormal(xfm,v);
    extractTextures(ours,shape);
    
    auto alphaParam = shape->findParam<float>("alpha");
    if (alphaParam) 
      ours->alpha = alphaParam->get(0);
    
    return ours;
  }